

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O0

void gf256_mul_mem(void *vz,void *vx,uint8_t y,int bytes)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i alVar5;
  __m256i alVar6;
  __m128i alVar7;
  __m128i alVar8;
  uint uVar9;
  long lVar10;
  uint in_ECX;
  byte in_DL;
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int offset;
  uint32_t word_1;
  uint32_t *z4;
  int four;
  uint64_t word;
  uint64_t *z8;
  uint8_t *table;
  uint8_t *x1;
  uint8_t *z1;
  __m128i h0_1;
  __m128i l0_1;
  __m128i x0_1;
  __m128i clr_mask_1;
  __m128i table_hi_y_1;
  __m128i table_lo_y_1;
  __m256i h0;
  __m256i l0;
  __m256i x0;
  __m256i *x32;
  __m256i *z32;
  __m256i clr_mask;
  __m256i table_hi_y;
  __m256i table_lo_y;
  __m128i *x16;
  __m128i *z16;
  undefined1 (*local_4f0) [32];
  undefined1 (*local_4e8) [32];
  ulong local_4e0;
  ulong uStack_4d8;
  ulong local_4d0;
  ulong uStack_4c8;
  ulong local_480;
  ulong uStack_478;
  ulong uStack_470;
  ulong uStack_468;
  ulong local_460;
  ulong uStack_458;
  ulong uStack_450;
  ulong uStack_448;
  undefined1 (*local_410) [32];
  undefined1 (*local_408) [32];
  undefined1 (*local_3a0) [32];
  undefined1 (*local_398) [32];
  uint local_390;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  if (in_DL < 2) {
    if (in_DL == 0) {
      memset(in_RDI,0,(long)(int)in_ECX);
    }
    else if (in_RDI != in_RSI) {
      memcpy(in_RDI,in_RSI,(long)(int)in_ECX);
    }
  }
  else {
    local_3a0 = in_RSI;
    local_398 = in_RDI;
    local_390 = in_ECX;
    if ((0x1f < (int)in_ECX) && (CpuHasAVX2)) {
      alVar5 = GF256Ctx.MM256.TABLE_LO_Y[in_DL];
      alVar6 = GF256Ctx.MM256.TABLE_HI_Y[in_DL];
      auVar12 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
      auVar12 = vpinsrb_avx(auVar12,0xf,2);
      auVar12 = vpinsrb_avx(auVar12,0xf,3);
      auVar12 = vpinsrb_avx(auVar12,0xf,4);
      auVar12 = vpinsrb_avx(auVar12,0xf,5);
      auVar12 = vpinsrb_avx(auVar12,0xf,6);
      auVar12 = vpinsrb_avx(auVar12,0xf,7);
      auVar12 = vpinsrb_avx(auVar12,0xf,8);
      auVar12 = vpinsrb_avx(auVar12,0xf,9);
      auVar12 = vpinsrb_avx(auVar12,0xf,10);
      auVar12 = vpinsrb_avx(auVar12,0xf,0xb);
      auVar12 = vpinsrb_avx(auVar12,0xf,0xc);
      auVar12 = vpinsrb_avx(auVar12,0xf,0xd);
      auVar12 = vpinsrb_avx(auVar12,0xf,0xe);
      auVar12 = vpinsrb_avx(auVar12,0xf,0xf);
      auVar11 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
      auVar11 = vpinsrb_avx(auVar11,0xf,2);
      auVar11 = vpinsrb_avx(auVar11,0xf,3);
      auVar11 = vpinsrb_avx(auVar11,0xf,4);
      auVar11 = vpinsrb_avx(auVar11,0xf,5);
      auVar11 = vpinsrb_avx(auVar11,0xf,6);
      auVar11 = vpinsrb_avx(auVar11,0xf,7);
      auVar11 = vpinsrb_avx(auVar11,0xf,8);
      auVar11 = vpinsrb_avx(auVar11,0xf,9);
      auVar11 = vpinsrb_avx(auVar11,0xf,10);
      auVar11 = vpinsrb_avx(auVar11,0xf,0xb);
      auVar11 = vpinsrb_avx(auVar11,0xf,0xc);
      auVar11 = vpinsrb_avx(auVar11,0xf,0xd);
      auVar11 = vpinsrb_avx(auVar11,0xf,0xe);
      auVar11 = vpinsrb_avx(auVar11,0xf,0xf);
      auVar11 = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar11;
      auVar12 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar12;
      uStack_90 = auVar12._0_8_;
      uStack_88 = auVar12._8_8_;
      local_410 = in_RSI;
      local_408 = in_RDI;
      do {
        auVar2._16_8_ = uStack_90;
        auVar2._0_16_ = auVar11;
        auVar2._24_8_ = uStack_88;
        auVar2 = vpand_avx2(*local_410,auVar2);
        auVar3 = vpsrlq_avx2(*local_410,ZEXT416(4));
        auVar4._16_8_ = uStack_90;
        auVar4._0_16_ = auVar11;
        auVar4._24_8_ = uStack_88;
        auVar3 = vpand_avx2(auVar3,auVar4);
        auVar2 = vpshufb_avx2((undefined1  [32])alVar5,auVar2);
        auVar3 = vpshufb_avx2((undefined1  [32])alVar6,auVar3);
        local_460 = auVar2._0_8_;
        uStack_458 = auVar2._8_8_;
        uStack_450 = auVar2._16_8_;
        uStack_448 = auVar2._24_8_;
        local_480 = auVar3._0_8_;
        uStack_478 = auVar3._8_8_;
        uStack_470 = auVar3._16_8_;
        uStack_468 = auVar3._24_8_;
        *(ulong *)*local_408 = local_460 ^ local_480;
        *(ulong *)(*local_408 + 8) = uStack_458 ^ uStack_478;
        *(ulong *)(*local_408 + 0x10) = uStack_450 ^ uStack_470;
        *(ulong *)(*local_408 + 0x18) = uStack_448 ^ uStack_468;
        local_390 = local_390 - 0x20;
        local_410 = local_410 + 1;
        local_408 = local_408 + 1;
        local_3a0 = local_410;
        local_398 = local_408;
      } while (0x1f < (int)local_390);
    }
    if ((0xf < (int)local_390) && ((CpuHasSSSE3 & 1U) != 0)) {
      alVar7 = GF256Ctx.MM128.TABLE_LO_Y[in_DL];
      alVar8 = GF256Ctx.MM128.TABLE_HI_Y[in_DL];
      auVar12 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
      auVar12 = vpinsrb_avx(auVar12,0xf,2);
      auVar12 = vpinsrb_avx(auVar12,0xf,3);
      auVar12 = vpinsrb_avx(auVar12,0xf,4);
      auVar12 = vpinsrb_avx(auVar12,0xf,5);
      auVar12 = vpinsrb_avx(auVar12,0xf,6);
      auVar12 = vpinsrb_avx(auVar12,0xf,7);
      auVar12 = vpinsrb_avx(auVar12,0xf,8);
      auVar12 = vpinsrb_avx(auVar12,0xf,9);
      auVar12 = vpinsrb_avx(auVar12,0xf,10);
      auVar12 = vpinsrb_avx(auVar12,0xf,0xb);
      auVar12 = vpinsrb_avx(auVar12,0xf,0xc);
      auVar12 = vpinsrb_avx(auVar12,0xf,0xd);
      auVar12 = vpinsrb_avx(auVar12,0xf,0xe);
      auVar12 = vpinsrb_avx(auVar12,0xf,0xf);
      do {
        auVar11 = vpand_avx(*(undefined1 (*) [16])*local_3a0,auVar12);
        auVar1 = vpsrlq_avx(*(undefined1 (*) [16])*local_3a0,ZEXT416(4));
        auVar1 = vpand_avx(auVar1,auVar12);
        auVar11 = vpshufb_avx((undefined1  [16])alVar7,auVar11);
        auVar1 = vpshufb_avx((undefined1  [16])alVar8,auVar1);
        local_4d0 = auVar11._0_8_;
        uStack_4c8 = auVar11._8_8_;
        local_4e0 = auVar1._0_8_;
        uStack_4d8 = auVar1._8_8_;
        *(ulong *)*local_398 = local_4d0 ^ local_4e0;
        *(ulong *)(*local_398 + 8) = uStack_4c8 ^ uStack_4d8;
        local_390 = local_390 - 0x10;
        local_3a0 = (undefined1 (*) [32])(*local_3a0 + 0x10);
        local_398 = (undefined1 (*) [32])(*local_398 + 0x10);
      } while (0xf < (int)local_390);
    }
    local_4e8 = local_398;
    local_4f0 = local_3a0;
    lVar10 = (ulong)in_DL * 0x100 + 0x12fbe0;
    for (; 7 < (int)local_390; local_390 = local_390 - 8) {
      *(ulong *)*local_4e8 =
           CONCAT17(*(undefined1 *)(lVar10 + (ulong)(byte)(*local_4f0)[7]),
                    CONCAT16(*(undefined1 *)(lVar10 + (ulong)(byte)(*local_4f0)[6]),
                             CONCAT15(*(undefined1 *)(lVar10 + (ulong)(byte)(*local_4f0)[5]),
                                      CONCAT14(*(undefined1 *)
                                                (lVar10 + (ulong)(byte)(*local_4f0)[4]),
                                               CONCAT13(*(undefined1 *)
                                                         (lVar10 + (ulong)(byte)(*local_4f0)[3]),
                                                        CONCAT12(*(undefined1 *)
                                                                  (lVar10 + (ulong)(byte)(*local_4f0
                                                                                         )[2]),
                                                                 CONCAT11(*(undefined1 *)
                                                                           (lVar10 + (ulong)(byte)(*
                                                  local_4f0)[1]),
                                                  *(undefined1 *)
                                                   (lVar10 + (ulong)(byte)(*local_4f0)[0]))))))));
      local_4f0 = (undefined1 (*) [32])(*local_4f0 + 8);
      local_4e8 = (undefined1 (*) [32])(*local_4e8 + 8);
    }
    uVar9 = local_390 & 4;
    if (uVar9 != 0) {
      *(uint *)*local_4e8 =
           CONCAT13(*(undefined1 *)(lVar10 + (ulong)(byte)(*local_4f0)[3]),
                    CONCAT12(*(undefined1 *)(lVar10 + (ulong)(byte)(*local_4f0)[2]),
                             CONCAT11(*(undefined1 *)(lVar10 + (ulong)(byte)(*local_4f0)[1]),
                                      *(undefined1 *)(lVar10 + (ulong)(byte)(*local_4f0)[0]))));
    }
    local_390 = local_390 & 3;
    if (local_390 != 1) {
      if (local_390 != 2) {
        if (local_390 != 3) {
          return;
        }
        (*local_4e8)[(int)(uVar9 + 2)] =
             *(undefined1 *)(lVar10 + (ulong)(byte)(*local_4f0)[(int)(uVar9 + 2)]);
      }
      (*local_4e8)[(int)(uVar9 + 1)] =
           *(undefined1 *)(lVar10 + (ulong)(byte)(*local_4f0)[(int)(uVar9 + 1)]);
    }
    (*local_4e8)[(int)uVar9] = *(undefined1 *)(lVar10 + (ulong)(byte)(*local_4f0)[(int)uVar9]);
  }
  return;
}

Assistant:

void gf256_mul_mem(void * GF256_RESTRICT vz, const void * GF256_RESTRICT vx, uint8_t y, int bytes)
{
    // Use a single if-statement to handle special cases
    if (y <= 1)
    {
        if (y == 0)
            memset(vz, 0, bytes);
        else if (vz != vx)
            memcpy(vz, vx, bytes);
        return;
    }

    GF256_M128 * GF256_RESTRICT z16 = reinterpret_cast<GF256_M128 *>(vz);
    const GF256_M128 * GF256_RESTRICT x16 = reinterpret_cast<const GF256_M128 *>(vx);

#if defined(GF256_TARGET_MOBILE)
#if defined(GF256_TRY_NEON)
    if (bytes >= 16 && CpuHasNeon)
    {
        // Partial product tables; see above
        const GF256_M128 table_lo_y = vld1q_u8((uint8_t*)(GF256Ctx.MM128.TABLE_LO_Y + y));
        const GF256_M128 table_hi_y = vld1q_u8((uint8_t*)(GF256Ctx.MM128.TABLE_HI_Y + y));

        // clr_mask = 0x0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f
        const GF256_M128 clr_mask = vdupq_n_u8(0x0f);

        // Handle multiples of 16 bytes
        do
        {
            // See above comments for details
            GF256_M128 x0 = vld1q_u8((uint8_t*)x16);
            GF256_M128 l0 = vandq_u8(x0, clr_mask);
            x0 = vshrq_n_u8(x0, 4);
            GF256_M128 h0 = vandq_u8(x0, clr_mask);
            l0 = vqtbl1q_u8(table_lo_y, l0);
            h0 = vqtbl1q_u8(table_hi_y, h0);
            vst1q_u8((uint8_t*)z16, veorq_u8(l0, h0));

            bytes -= 16, ++x16, ++z16;
        } while (bytes >= 16);
    }
#endif
#else
# if defined(GF256_TRY_AVX2)
    if (bytes >= 32 && CpuHasAVX2)
    {
        // Partial product tables; see above
        const GF256_M256 table_lo_y = _mm256_loadu_si256(GF256Ctx.MM256.TABLE_LO_Y + y);
        const GF256_M256 table_hi_y = _mm256_loadu_si256(GF256Ctx.MM256.TABLE_HI_Y + y);

        // clr_mask = 0x0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f
        const GF256_M256 clr_mask = _mm256_set1_epi8(0x0f);

        GF256_M256 * GF256_RESTRICT z32 = reinterpret_cast<GF256_M256 *>(vz);
        const GF256_M256 * GF256_RESTRICT x32 = reinterpret_cast<const GF256_M256 *>(vx);

        // Handle multiples of 32 bytes
        do
        {
            // See above comments for details
            GF256_M256 x0 = _mm256_loadu_si256(x32);
            GF256_M256 l0 = _mm256_and_si256(x0, clr_mask);
            x0 = _mm256_srli_epi64(x0, 4);
            GF256_M256 h0 = _mm256_and_si256(x0, clr_mask);
            l0 = _mm256_shuffle_epi8(table_lo_y, l0);
            h0 = _mm256_shuffle_epi8(table_hi_y, h0);
            _mm256_storeu_si256(z32, _mm256_xor_si256(l0, h0));

            bytes -= 32, ++x32, ++z32;
        } while (bytes >= 32);

        z16 = reinterpret_cast<GF256_M128 *>(z32);
        x16 = reinterpret_cast<const GF256_M128 *>(x32);
    }
# endif // GF256_TRY_AVX2
    if (bytes >= 16 && CpuHasSSSE3)
    {
        // Partial product tables; see above
        const GF256_M128 table_lo_y = _mm_loadu_si128(GF256Ctx.MM128.TABLE_LO_Y + y);
        const GF256_M128 table_hi_y = _mm_loadu_si128(GF256Ctx.MM128.TABLE_HI_Y + y);

        // clr_mask = 0x0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f0f
        const GF256_M128 clr_mask = _mm_set1_epi8(0x0f);

        // Handle multiples of 16 bytes
        do
        {
            // See above comments for details
            GF256_M128 x0 = _mm_loadu_si128(x16);
            GF256_M128 l0 = _mm_and_si128(x0, clr_mask);
            x0 = _mm_srli_epi64(x0, 4);
            GF256_M128 h0 = _mm_and_si128(x0, clr_mask);
            l0 = _mm_shuffle_epi8(table_lo_y, l0);
            h0 = _mm_shuffle_epi8(table_hi_y, h0);
            _mm_storeu_si128(z16, _mm_xor_si128(l0, h0));

            bytes -= 16, ++x16, ++z16;
        } while (bytes >= 16);
    }
#endif

    uint8_t * GF256_RESTRICT z1 = reinterpret_cast<uint8_t*>(z16);
    const uint8_t * GF256_RESTRICT x1 = reinterpret_cast<const uint8_t*>(x16);
    const uint8_t * GF256_RESTRICT table = GF256Ctx.GF256_MUL_TABLE + ((unsigned)y << 8);

    // Handle blocks of 8 bytes
    while (bytes >= 8)
    {
        uint64_t * GF256_RESTRICT z8 = reinterpret_cast<uint64_t *>(z1);
#ifdef GF256_IS_BIG_ENDIAN
        uint64_t word = (uint64_t)table[x1[0]] << 56;
        word |= (uint64_t)table[x1[1]] << 48;
        word |= (uint64_t)table[x1[2]] << 40;
        word |= (uint64_t)table[x1[3]] << 32;
        word |= (uint64_t)table[x1[4]] << 24;
        word |= (uint64_t)table[x1[5]] << 16;
        word |= (uint64_t)table[x1[6]] << 8;
        word |= (uint64_t)table[x1[7]];
#else
        uint64_t word = table[x1[0]];
        word |= (uint64_t)table[x1[1]] << 8;
        word |= (uint64_t)table[x1[2]] << 16;
        word |= (uint64_t)table[x1[3]] << 24;
        word |= (uint64_t)table[x1[4]] << 32;
        word |= (uint64_t)table[x1[5]] << 40;
        word |= (uint64_t)table[x1[6]] << 48;
        word |= (uint64_t)table[x1[7]] << 56;
#endif
        *z8 = word;

        bytes -= 8, x1 += 8, z1 += 8;
    }

    // Handle a block of 4 bytes
    const int four = bytes & 4;
    if (four)
    {
        uint32_t * GF256_RESTRICT z4 = reinterpret_cast<uint32_t *>(z1);
#ifdef GF256_IS_BIG_ENDIAN
        uint32_t word = (uint32_t)table[x1[0]] << 24;
        word |= (uint32_t)table[x1[1]] << 16;
        word |= (uint32_t)table[x1[2]] << 8;
        word |= (uint32_t)table[x1[3]];
#else
        uint32_t word = table[x1[0]];
        word |= (uint32_t)table[x1[1]] << 8;
        word |= (uint32_t)table[x1[2]] << 16;
        word |= (uint32_t)table[x1[3]] << 24;
#endif
        *z4 = word;
    }

    // Handle single bytes
    const int offset = four;
    switch (bytes & 3)
    {
    case 3: z1[offset + 2] = table[x1[offset + 2]];
    case 2: z1[offset + 1] = table[x1[offset + 1]];
    case 1: z1[offset] = table[x1[offset]];
    default:
        break;
    }
}